

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O2

void mac_block(gost_ctx *c,byte *buffer,byte *block)

{
  int i;
  int iVar1;
  word32 wVar2;
  int iVar3;
  word32 wVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  
  for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
    buffer[lVar10] = buffer[lVar10] ^ block[lVar10];
  }
  uVar12 = *(uint *)buffer;
  uVar11 = *(uint *)(buffer + 4);
  iVar1 = c->mask[0] + c->key[0];
  wVar2 = f(c,iVar1 + uVar12);
  iVar3 = c->mask[1] + c->key[1];
  wVar4 = f(c,iVar3 + (wVar2 ^ uVar11));
  uVar12 = wVar4 ^ uVar12;
  iVar5 = c->mask[2] + c->key[2];
  wVar4 = f(c,iVar5 + uVar12);
  uVar11 = wVar4 ^ wVar2 ^ uVar11;
  iVar6 = c->mask[3] + c->key[3];
  wVar2 = f(c,iVar6 + uVar11);
  uVar12 = wVar2 ^ uVar12;
  iVar7 = c->mask[4] + c->key[4];
  wVar2 = f(c,iVar7 + uVar12);
  uVar11 = wVar2 ^ uVar11;
  iVar8 = c->mask[5] + c->key[5];
  wVar2 = f(c,iVar8 + uVar11);
  uVar12 = wVar2 ^ uVar12;
  iVar9 = c->mask[6] + c->key[6];
  wVar2 = f(c,iVar9 + uVar12);
  uVar11 = wVar2 ^ uVar11;
  iVar13 = c->mask[7] + c->key[7];
  wVar2 = f(c,iVar13 + uVar11);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar1 + uVar12);
  uVar11 = wVar2 ^ uVar11;
  wVar2 = f(c,iVar3 + uVar11);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar5 + uVar12);
  uVar11 = wVar2 ^ uVar11;
  wVar2 = f(c,iVar6 + uVar11);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar7 + uVar12);
  uVar11 = wVar2 ^ uVar11;
  wVar2 = f(c,iVar8 + uVar11);
  uVar12 = wVar2 ^ uVar12;
  wVar2 = f(c,iVar9 + uVar12);
  uVar11 = wVar2 ^ uVar11;
  wVar2 = f(c,iVar13 + uVar11);
  uVar12 = wVar2 ^ uVar12;
  *buffer = (byte)uVar12;
  buffer[1] = (byte)(uVar12 >> 8);
  buffer[2] = (byte)(uVar12 >> 0x10);
  buffer[3] = (byte)(uVar12 >> 0x18);
  buffer[4] = (byte)uVar11;
  buffer[5] = (byte)(uVar11 >> 8);
  buffer[6] = (byte)(uVar11 >> 0x10);
  buffer[7] = (byte)(uVar11 >> 0x18);
  return;
}

Assistant:

void mac_block(gost_ctx * c, byte * buffer, const byte * block)
{
    register word32 n1, n2;     /* As named in the GOST */
    int i;
    for (i = 0; i < 8; i++) {
        buffer[i] ^= block[i];
    }
    n1 = buffer[0] | (buffer[1] << 8) | (buffer[2] << 16) | ((word32)
                                                             buffer[3] << 24);
    n2 = buffer[4] | (buffer[5] << 8) | (buffer[6] << 16) | ((word32)
                                                             buffer[7] << 24);
    /* Instead of swapping halves, swap names each round */

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    buffer[0] = (byte) (n1 & 0xff);
    buffer[1] = (byte) ((n1 >> 8) & 0xff);
    buffer[2] = (byte) ((n1 >> 16) & 0xff);
    buffer[3] = (byte) (n1 >> 24);
    buffer[4] = (byte) (n2 & 0xff);
    buffer[5] = (byte) ((n2 >> 8) & 0xff);
    buffer[6] = (byte) ((n2 >> 16) & 0xff);
    buffer[7] = (byte) (n2 >> 24);
}